

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O2

size_t __thiscall
xmrig::Threads<xmrig::OclThreads>::move
          (Threads<xmrig::OclThreads> *this,char *profile,OclThreads *threads)

{
  pointer pOVar1;
  pointer pOVar2;
  bool bVar3;
  size_t sVar4;
  char *profile_local;
  pair<const_xmrig::String,_xmrig::OclThreads> local_48;
  
  profile_local = profile;
  bVar3 = has(this);
  if (bVar3) {
    sVar4 = 0;
  }
  else {
    pOVar1 = (threads->m_data).
             super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pOVar2 = (threads->m_data).
             super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = ((long)pOVar1 - (long)pOVar2) / 0x48;
    if (pOVar1 != pOVar2) {
      std::pair<const_xmrig::String,_xmrig::OclThreads>::
      pair<const_char_*&,_xmrig::OclThreads,_true>(&local_48,&profile_local,threads);
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::OclThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::OclThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::OclThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::OclThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::OclThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::OclThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::OclThreads>>>
                  *)this,&local_48);
      std::pair<const_xmrig::String,_xmrig::OclThreads>::~pair(&local_48);
    }
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }